

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathOp.cpp
# Opt level: O2

void __thiscall MathOp::Hada_Mat::back(Hada_Mat *this)

{
  int *piVar1;
  int iVar2;
  bool bVar3;
  Mat *pMVar4;
  Mat *pMVar5;
  Mat local_40;
  
  iVar2 = (this->super_Op).backRound;
  (this->super_Op).backRound = iVar2 + 1;
  if (iVar2 == 2) {
    pMVar4 = this->temp_a;
    pMVar5 = NeuronMat::getGrad(this->a);
    Mat::operator+=(pMVar5,pMVar4);
    pMVar4 = this->temp_b;
    pMVar5 = NeuronMat::getGrad(this->b);
    Mat::operator+=(pMVar5,pMVar4);
    return;
  }
  if (iVar2 != 1) {
    if (iVar2 != 0) {
      return;
    }
    bVar3 = NeuronMat::getIsBack(this->a);
    if (!bVar3) {
      pMVar4 = NeuronMat::getGrad(this->res);
      pMVar5 = NeuronMat::getForward(this->b);
      Mat::dot(&local_40,pMVar4,pMVar5);
      Mat::operator=(this->temp_a,&local_40);
      Mat::~Mat(&local_40);
    }
    bVar3 = NeuronMat::getIsBack(this->b);
    if (bVar3) {
      return;
    }
    pMVar4 = NeuronMat::getGrad(this->res);
    pMVar5 = NeuronMat::getForward(this->a);
    Mat::dot(&local_40,pMVar4,pMVar5);
    Mat::operator=(this->temp_b,&local_40);
    Mat::~Mat(&local_40);
    return;
  }
  bVar3 = NeuronMat::getIsBack(this->a);
  if (!bVar3) {
    (**(this->div2mP_b_a->super_Op)._vptr_Op)();
  }
  bVar3 = NeuronMat::getIsBack(this->b);
  if (!bVar3) {
    (**(this->div2mP_b_b->super_Op)._vptr_Op)();
  }
  bVar3 = NeuronMat::getIsBack(this->a);
  if ((bVar3) || (bVar3 = Op::forwardHasNext(&this->div2mP_b_a->super_Op), !bVar3)) {
    bVar3 = NeuronMat::getIsBack(this->b);
    if (bVar3) {
      return;
    }
    bVar3 = Op::forwardHasNext(&this->div2mP_b_b->super_Op);
    if (!bVar3) {
      return;
    }
  }
  piVar1 = &(this->super_Op).backRound;
  *piVar1 = *piVar1 + -1;
  return;
}

Assistant:

void MathOp::Hada_Mat::back() {
    backRound++;
    //cout<<"hada backing..."<<endl;
    switch (backRound) {
        case 1: {
           // cout<<"case 1"<<endl;
            if (!a->getIsBack()) {
           //     cout<<"a getGrad1"<<endl;
                *temp_a = (*res->getGrad()).dot(*b->getForward());
           //     cout<<"a getGrad2"<<endl;
            }
            if (!b->getIsBack()) {
          //      cout<<"b getGrad1"<<endl;
                *temp_b = (*res->getGrad()).dot(*a->getForward());
          //      cout<<"b getGrad2"<<endl;
            }
        }
            break;
        case 2:
          //  cout<<"case 2"<<endl;
            if (!a->getIsBack()) {
          //      cout<<"a div2mp1"<<endl;
                div2mP_b_a->forward();
         //       cout<<"a div2mp2"<<endl;
            }
            if (!b->getIsBack()) {
         //       cout<<"b div2mp1"<<endl;
                div2mP_b_b->forward();
          //      cout<<"b div2mp2"<<endl;
            }
            if ((!a->getIsBack() && div2mP_b_a->forwardHasNext()) ||
                (!b->getIsBack() && div2mP_b_b->forwardHasNext())) {
                backRound--;
            }
            break;
        case 3:
            *a->getGrad()+=*temp_a;
            *b->getGrad()+=*temp_b;
    }
   // cout<<"hada backed..."<<endl;
}